

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineLimitTests.cpp
# Opt level: O0

void __thiscall
agge::tests::LimitEllipsisTests::TrimPositionIsResetOnNewLine(LimitEllipsisTests *this)

{
  bool value;
  allocator local_1e9;
  string local_1e8;
  LocationInfo local_1c8;
  char *local_1a0;
  allocator local_191;
  string local_190;
  LocationInfo local_170;
  allocator local_141;
  string local_140;
  LocationInfo local_120;
  allocator local_f1;
  string local_f0;
  LocationInfo local_d0;
  undefined1 local_94 [8];
  ellipsis e;
  char *i;
  char *end;
  char *begin;
  layout_builder b;
  LimitEllipsisTests *this_local;
  
  b.state = (state)this;
  mocks::layout_builder::layout_builder((layout_builder *)&begin);
  e._28_8_ = anon_var_dwarf_17e87;
  limit::ellipsis::ellipsis((ellipsis *)local_94,50.0,0x2026);
  limit::ellipsis::begin_style<agge::tests::mocks::layout_builder>
            ((ellipsis *)local_94,(layout_builder *)&begin);
  b.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x42380000;
  b.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 10;
  limit::ellipsis::add_glyph<agge::tests::mocks::layout_builder,char_const*>
            ((ellipsis *)local_94,(layout_builder *)&begin,0x19,5.0,(char **)&e._at_symbol.second,
             "oobar","");
  std::
  vector<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ::clear((vector<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
           *)&b.trimmed_at.
              super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>::clear
            ((vector<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_> *)
             &b.ellipsis_symbol.second);
  limit::ellipsis::new_line((ellipsis *)local_94);
  b.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x42393333;
  value = limit::ellipsis::add_glyph<agge::tests::mocks::layout_builder,char_const*>
                    ((ellipsis *)local_94,(layout_builder *)&begin,0x19,4.1,
                     (char **)&e._at_symbol.second,"bar","");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,&local_f1);
  ut::LocationInfo::LocationInfo(&local_d0,&local_f0,0x181);
  ut::is_false(value,&local_d0);
  ut::LocationInfo::~LocationInfo(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,&local_141);
  ut::LocationInfo::LocationInfo(&local_120,&local_140,0x184);
  ut::
  is_empty<std::vector<std::pair<unsigned_long,std::pair<unsigned_int,float>>,std::allocator<std::pair<unsigned_long,std::pair<unsigned_int,float>>>>>
            ((vector<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
              *)&b.trimmed_at.
                 super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_120);
  ut::LocationInfo::~LocationInfo(&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,&local_191);
  ut::LocationInfo::LocationInfo(&local_170,&local_190,0x185);
  ut::is_empty<std::vector<agge::layout_builder::state,std::allocator<agge::layout_builder::state>>>
            ((vector<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_> *)
             &b.ellipsis_symbol.second,&local_170);
  ut::LocationInfo::~LocationInfo(&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  local_1a0 = "oobar";
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,&local_1e9);
  ut::LocationInfo::LocationInfo(&local_1c8,&local_1e8,0x186);
  ut::are_equal<char_const*,char_const*>(&local_1a0,(char **)&e._at_symbol.second,&local_1c8);
  ut::LocationInfo::~LocationInfo(&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  mocks::layout_builder::~layout_builder((layout_builder *)&begin);
  return;
}

Assistant:

test( TrimPositionIsResetOnNewLine )
			{
				// INIT
				mocks::layout_builder b;
				const char *const begin = "foobar", *const end = begin + 6;
				const char *i = begin;
				limit::ellipsis e(50.0f);

				e.begin_style(b);
				b.state.extent = 50.0f - 4.0f;
				b.state.next = 10;

				e.add_glyph(b, 25, 5.0f, i, begin + 1, end);
				b.appended.clear();
				b.trimmed_at.clear();

				// ACT
				e.new_line();
				b.state.extent = 50.0f - 3.7f; // not enough space for the ellipsis
				assert_is_false(e.add_glyph(b, 25, 4.1f, i, begin + 3, end));

				// ASSERT
				assert_is_empty(b.appended);
				assert_is_empty(b.trimmed_at);
				assert_equal(begin + 1, i);
			}